

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int addk(FuncState *fs,TValue *k,TValue *v)

{
  lua_State *L_00;
  GCObject *o;
  TValue *pTVar1;
  Table *pTVar2;
  Value *pVVar3;
  TValue *o1;
  TValue *o2;
  TValue *i_o;
  int oldsize;
  Proto *f;
  TValue *idx;
  lua_State *L;
  TValue *v_local;
  TValue *k_local;
  FuncState *fs_local;
  
  L_00 = fs->L;
  pTVar1 = luaH_set(L_00,fs->h,k);
  o = (GCObject *)fs->f;
  i_o._4_4_ = (o->p).sizek;
  if (pTVar1->tt == 3) {
    fs_local._4_4_ = (int)(pTVar1->value).n;
  }
  else {
    (pTVar1->value).n = (double)fs->nk;
    pTVar1->tt = 3;
    if ((o->p).sizek < fs->nk + 1) {
      pTVar2 = (Table *)luaM_growaux_(L_00,(o->h).metatable,&(o->p).sizek,0x10,0x3ffff,
                                      "constant table overflow");
      (o->h).metatable = pTVar2;
    }
    while (i_o._4_4_ < (o->p).sizek) {
      *(undefined4 *)(&((o->h).metatable)->tt + (long)i_o._4_4_ * 0x10) = 0;
      i_o._4_4_ = i_o._4_4_ + 1;
    }
    pVVar3 = (Value *)(&((o->h).metatable)->next + (long)fs->nk * 2);
    *pVVar3 = v->value;
    pVVar3[1].b = v->tt;
    if (((3 < v->tt) && (((((v->value).gc)->gch).marked & 3) != 0)) && (((o->gch).marked & 4) != 0))
    {
      luaC_barrierf(L_00,o,(v->value).gc);
    }
    fs_local._4_4_ = fs->nk;
    fs->nk = fs_local._4_4_ + 1;
  }
  return fs_local._4_4_;
}

Assistant:

static int addk(FuncState*fs,TValue*k,TValue*v){
lua_State*L=fs->L;
TValue*idx=luaH_set(L,fs->h,k);
Proto*f=fs->f;
int oldsize=f->sizek;
if(ttisnumber(idx)){
return cast_int(nvalue(idx));
}
else{
setnvalue(idx,cast_num(fs->nk));
luaM_growvector(L,f->k,fs->nk,f->sizek,TValue,
((1<<(9+9))-1),"constant table overflow");
while(oldsize<f->sizek)setnilvalue(&f->k[oldsize++]);
setobj(L,&f->k[fs->nk],v);
luaC_barrier(L,f,v);
return fs->nk++;
}
}